

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void Commands::ReloadConfig
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,Command_Source *from)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 extraout_var;
  string local_38 [32];
  Command_Source *local_18;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  local_18 = from;
  from_local = (Command_Source *)arguments;
  (*from->_vptr_Command_Source[2])();
  uVar2 = std::__cxx11::string::c_str();
  Console::Out("Config reloaded by %s",uVar2);
  std::__cxx11::string::~string(local_38);
  iVar1 = (*local_18->_vptr_Command_Source[4])();
  World::Rehash((World *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void ReloadConfig(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Out("Config reloaded by %s", from->SourceName().c_str());
	from->SourceWorld()->Rehash();
}